

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

uint32_t simd::getSimdSize(SIMDType simdType)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if (simdType < 4) {
    uVar1 = *(uint32_t *)(&DAT_001db520 + (ulong)simdType * 4);
  }
  return uVar1;
}

Assistant:

uint32_t getSimdSize( SIMDType simdType )
    {
        if ( simdType == avx_function )
            return avx::simdSize;
        if ( simdType == sse_function )
            return sse::simdSize;
        if ( simdType == neon_function )
            return neon::simdSize;
        if ( simdType == cpu_function )
            return 1u;

        return 0u;
    }